

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

int color_tree_get(ColorTree *tree,uchar r,uchar g,uchar b,uchar a)

{
  byte bVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  undefined3 in_register_00000031;
  undefined3 in_register_00000081;
  
  uVar2 = 0;
  do {
    if (uVar2 == 8) {
      if (tree == (ColorTree *)0x0) {
        return -1;
      }
      return tree->index;
    }
    bVar1 = (byte)uVar2;
    tree = tree->children
           [(uint)((CONCAT31(in_register_00000081,a) >> (uVar2 & 0x1f) & 1) != 0) +
            (CONCAT31(in_register_00000011,g) >> (bVar1 & 0x1f) & 1) * 4 +
            (CONCAT31(in_register_00000031,r) >> (bVar1 & 0x1f) & 1) * 8 +
            ((uint)CONCAT71(in_register_00000009,b) >> (bVar1 & 0x1f) & 1) * 2];
    uVar2 = uVar2 + 1;
  } while (tree != (ColorTree *)0x0);
  return -1;
}

Assistant:

static int color_tree_get(ColorTree* tree, unsigned char r, unsigned char g, unsigned char b, unsigned char a) {
  int bit = 0;
  for(bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i]) return -1;
    else tree = tree->children[i];
  }
  return tree ? tree->index : -1;
}